

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  ushort uVar5;
  size_t sVar6;
  size_t sVar7;
  BrotliEncoderDictionary *pBVar8;
  void *pvVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  uint64_t uVar12;
  HasherCommon *pHVar13;
  uint8_t *puVar14;
  BrotliDictionary *pBVar15;
  undefined8 uVar16;
  int iVar17;
  size_t sVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  byte bVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  void *pvVar29;
  ulong uVar30;
  uint uVar31;
  uint32_t uVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  void *pvVar36;
  ulong uVar37;
  void *pvVar38;
  long lVar39;
  ulong *puVar40;
  uint16_t uVar41;
  uint uVar42;
  void *pvVar43;
  void *pvVar44;
  ulong uVar45;
  void *pvVar46;
  ulong uVar47;
  uint8_t *s1_orig;
  ulong uVar48;
  ulong uVar49;
  int iVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  int iVar57;
  bool bVar58;
  uint local_190;
  ulong local_180;
  void *local_168;
  ulong local_140;
  void *local_138;
  size_t local_128;
  Command *local_f8;
  uint local_d4;
  ulong local_d0;
  void *local_b8;
  ulong local_a0;
  uint8_t *s1_orig_1;
  
  iVar35 = params->lgwin;
  pvVar3 = (void *)((position - 7) + num_bytes);
  pvVar23 = (void *)position;
  if (7 < num_bytes) {
    pvVar23 = pvVar3;
  }
  lVar24 = 0x200;
  if (params->quality < 9) {
    lVar24 = 0x40;
  }
  sVar6 = params->stream_offset;
  uVar1 = position + num_bytes;
  local_128 = *last_insert_len;
  sVar7 = (params->dictionary).compound.total_size;
  uVar34 = (uint)(hasher->privat)._H35.hb.next_ix;
  if (4 < (int)uVar34) {
    iVar50 = *dist_cache;
    dist_cache[4] = iVar50 + -1;
    dist_cache[5] = iVar50 + 1;
    dist_cache[6] = iVar50 + -2;
    dist_cache[7] = iVar50 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar50 + 3,iVar50 + -3);
    if (10 < uVar34) {
      iVar50 = dist_cache[1];
      dist_cache[10] = iVar50 + -1;
      dist_cache[0xb] = iVar50 + 1;
      dist_cache[0xc] = iVar50 + -2;
      dist_cache[0xd] = iVar50 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar50 + 3,iVar50 + -3);
    }
  }
  pvVar4 = (void *)((1L << ((byte)iVar35 & 0x3f)) - 0x10);
  pvVar44 = (void *)(lVar24 + position);
  lVar25 = sVar7 + 1;
  local_f8 = commands;
LAB_00e16766:
LAB_00e16777:
  pvVar38 = (void *)position;
  if (uVar1 <= (long)pvVar38 + 8U) {
    *last_insert_len = (local_128 + uVar1) - (long)pvVar38;
    *num_commands = *num_commands + ((long)local_f8 - (long)commands >> 4);
    return;
  }
  pvVar46 = pvVar4;
  if (pvVar38 < pvVar4) {
    pvVar46 = pvVar38;
  }
  pvVar29 = (void *)(sVar6 + (long)pvVar38);
  if (pvVar4 <= (void *)(sVar6 + (long)pvVar38)) {
    pvVar29 = pvVar4;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_d4 = 0;
    local_a0 = 0;
    goto LAB_00e1681b;
  }
  if (pvVar38 == (void *)0x0) {
    local_a0 = 0;
LAB_00e167f4:
    uVar26 = 0;
  }
  else {
    local_a0 = (ulong)ringbuffer[(long)pvVar38 - 1U & ringbuffer_mask];
    if (pvVar38 == (void *)0x1) goto LAB_00e167f4;
    uVar26 = (ulong)ringbuffer[(long)pvVar38 - 2U & ringbuffer_mask];
  }
  local_d4 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar26 + 0x100] | literal_context_lut[local_a0]];
LAB_00e1681b:
  uVar26 = uVar1 - (long)pvVar38;
  pBVar8 = (params->dictionary).contextual.dict[local_d4];
  pvVar9 = (void *)(params->dist).max_distance;
  puVar10 = (hasher->privat)._H5.buckets_;
  puVar11 = (hasher->privat)._H6.buckets_;
  uVar19 = (ulong)pvVar38 & ringbuffer_mask;
  puVar20 = (ulong *)(ringbuffer + uVar19);
  uVar48 = 0x7e4;
  pvVar43 = (void *)0x0;
  uVar55 = 0;
  uVar53 = 0;
  uVar21 = 0;
  do {
    if (uVar53 == (long)(hasher->privat)._H6.num_last_distances_to_check_) {
      uVar53 = (hasher->privat)._H5.block_size_;
      uVar12 = (hasher->privat)._H6.hash_mul_;
      uVar27 = *puVar20 * uVar12 >> 0x31;
      lVar39 = uVar27 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      uVar5 = *(ushort *)((long)puVar10 + uVar27 * 2);
      uVar52 = (ulong)uVar5;
      uVar51 = 0;
      if (uVar53 <= uVar52) {
        uVar51 = uVar52 - uVar53;
      }
      uVar34 = (hasher->privat)._H6.block_mask_;
      do {
        uVar30 = uVar21;
        local_180 = uVar55;
        uVar45 = uVar48;
        local_138 = pvVar43;
        uVar56 = uVar30 + uVar19;
        do {
          do {
            do {
              uVar42 = (uint)ringbuffer_mask;
              if (uVar52 <= uVar51) {
LAB_00e16b38:
                puVar11[lVar39 + (ulong)(uVar34 & uVar5)] = (uint32_t)pvVar38;
                *(ushort *)((long)puVar10 + uVar27 * 2) = uVar5 + 1;
                if (uVar45 != 0x7e4) {
                  iVar35 = 0;
                  goto LAB_00e16da3;
                }
                pHVar13 = (hasher->privat)._H6.common_;
                uVar48 = pHVar13->dict_num_lookups;
                local_140 = pHVar13->dict_num_matches;
                uVar45 = 0x7e4;
                if (uVar48 >> 7 <= local_140) {
                  uVar55 = (ulong)((uint)((int)*puVar20 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar14 = pBVar8->hash_table_lengths;
                  iVar35 = 0;
                  lVar39 = 0;
                  goto LAB_00e16c04;
                }
                iVar35 = 0;
                goto LAB_00e16da3;
              }
              uVar52 = uVar52 - 1;
              pvVar43 = (void *)((long)pvVar38 -
                                (ulong)puVar11[lVar39 + (ulong)((uint)uVar52 & uVar34)]);
              if (pvVar46 < pvVar43) goto LAB_00e16b38;
            } while (ringbuffer_mask < uVar56);
            uVar55 = (ulong)(puVar11[lVar39 + (ulong)((uint)uVar52 & uVar34)] & uVar42);
            uVar48 = uVar55 + uVar30;
          } while (((ringbuffer_mask < uVar48) || (ringbuffer[uVar56] != ringbuffer[uVar48])) ||
                  (*(int *)(ringbuffer + uVar55) != (int)*puVar20));
          lVar54 = 0;
          uVar48 = uVar26 - 4;
LAB_00e16ac3:
          if (uVar48 < 8) {
            for (; ((long)pvVar38 + (lVar54 - uVar1) != -4 &&
                   (ringbuffer[lVar54 + uVar55 + 4] == *(uint8_t *)((long)puVar20 + lVar54 + 4)));
                lVar54 = lVar54 + 1) {
            }
          }
          else {
            uVar21 = *(ulong *)((long)puVar20 + lVar54 + 4);
            if (uVar21 == *(ulong *)(ringbuffer + lVar54 + uVar55 + 4)) goto code_r0x00e16ad7;
            uVar21 = *(ulong *)(ringbuffer + lVar54 + uVar55 + 4) ^ uVar21;
            uVar48 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
              }
            }
            lVar54 = lVar54 + (uVar48 >> 3 & 0x1fffffff);
          }
          uVar55 = lVar54 + 4;
          iVar35 = 0x1f;
          if ((uint)pvVar43 != 0) {
            for (; (uint)pvVar43 >> iVar35 == 0; iVar35 = iVar35 + -1) {
            }
          }
          uVar48 = (ulong)(iVar35 * -0x1e + 0x780) + uVar55 * 0x87;
          uVar21 = uVar55;
        } while (uVar48 <= uVar45);
      } while( true );
    }
    pvVar36 = (void *)(long)dist_cache[uVar53];
    if (((pvVar36 <= pvVar46) && ((void *)((long)pvVar38 - (long)pvVar36) < pvVar38)) &&
       (uVar21 + uVar19 <= ringbuffer_mask)) {
      uVar27 = (ulong)((long)pvVar38 - (long)pvVar36) & ringbuffer_mask;
      uVar51 = uVar27 + uVar21;
      if ((uVar51 <= ringbuffer_mask) && (ringbuffer[uVar21 + uVar19] == ringbuffer[uVar51])) {
        puVar28 = (ulong *)(ringbuffer + uVar27);
        lVar39 = 0;
        puVar40 = puVar20;
        uVar51 = uVar26;
LAB_00e168ff:
        if (uVar51 < 8) {
          for (uVar27 = 0;
              (uVar51 != uVar27 &&
              (*(char *)((long)puVar28 + uVar27) == *(char *)((long)puVar40 + uVar27)));
              uVar27 = uVar27 + 1) {
          }
        }
        else {
          if (*puVar40 == *puVar28) goto code_r0x00e16911;
          uVar27 = *puVar28 ^ *puVar40;
          uVar51 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
            }
          }
          uVar27 = uVar51 >> 3 & 0x1fffffff;
        }
        uVar27 = uVar27 - lVar39;
        if (((2 < uVar27) || ((uVar53 < 2 && (uVar27 == 2)))) &&
           (uVar51 = uVar27 * 0x87 + 0x78f, uVar48 < uVar51)) {
          if (uVar53 != 0) {
            uVar51 = uVar51 - ((0x1ca10U >> ((byte)uVar53 & 0xe) & 0xe) + 0x27);
          }
          if (uVar48 < uVar51) {
            pvVar43 = pvVar36;
            uVar48 = uVar51;
            uVar55 = uVar27;
            uVar21 = uVar27;
          }
        }
      }
    }
    uVar53 = uVar53 + 1;
  } while( true );
LAB_00e16c04:
  if (lVar39 == 2) goto LAB_00e16da3;
  uVar48 = uVar48 + 1;
  pHVar13->dict_num_lookups = uVar48;
  bVar22 = puVar14[uVar55];
  uVar21 = (ulong)bVar22;
  if ((uVar21 != 0) && (uVar21 <= uVar26)) {
    pBVar15 = pBVar8->words;
    puVar28 = (ulong *)(pBVar15->data +
                       (ulong)pBVar15->offsets_by_length[uVar21] +
                       pBVar8->hash_table_words[uVar55] * uVar21);
    lVar54 = 0;
    uVar19 = uVar21;
    puVar40 = puVar20;
LAB_00e16c6d:
    if (uVar19 < 8) {
      for (uVar19 = 0;
          ((bVar22 & 7) != uVar19 &&
          (*(char *)((long)puVar40 + uVar19) == *(char *)((long)puVar28 + uVar19)));
          uVar19 = uVar19 + 1) {
      }
    }
    else {
      if (*puVar28 == *puVar40) goto code_r0x00e16c7f;
      uVar51 = *puVar40 ^ *puVar28;
      uVar19 = 0;
      if (uVar51 != 0) {
        for (; (uVar51 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      uVar19 = uVar19 >> 3 & 0x1fffffff;
    }
    uVar19 = uVar19 - lVar54;
    if (((uVar19 != 0) && (uVar21 < pBVar8->cutoffTransformsCount + uVar19)) &&
       (pvVar43 = (void *)((long)pvVar29 +
                          ((ulong)((uint)(pBVar8->cutoffTransforms >>
                                         ((char)(uVar21 - uVar19) * '\x06' & 0x3fU)) & 0x3f) +
                           (uVar21 - uVar19) * 4 << (pBVar15->size_bits_by_length[uVar21] & 0x3f)) +
                          (ulong)pBVar8->hash_table_words[uVar55] + lVar25), pvVar43 <= pvVar9)) {
      iVar50 = 0x1f;
      if ((uint)pvVar43 != 0) {
        for (; (uint)pvVar43 >> iVar50 == 0; iVar50 = iVar50 + -1) {
        }
      }
      uVar21 = (uVar19 * 0x87 - (ulong)(uint)(iVar50 * 0x1e)) + 0x780;
      if (uVar45 <= uVar21) {
        iVar35 = (uint)bVar22 - (int)uVar19;
        local_140 = local_140 + 1;
        pHVar13->dict_num_matches = local_140;
        uVar45 = uVar21;
        local_180 = uVar19;
        local_138 = pvVar43;
      }
    }
  }
  lVar39 = lVar39 + 1;
  uVar55 = uVar55 + 1;
  goto LAB_00e16c04;
LAB_00e16da3:
  if (0x1f < uVar26) {
    for (pvVar29 = (hasher->privat)._H35.ha_common.extra[3]; pvVar29 <= pvVar38;
        pvVar29 = (void *)((long)pvVar29 + 1)) {
      uVar34 = (hasher->privat)._H65.hb.state;
      uVar31 = uVar34 & 0x3fffffff;
      (hasher->privat)._H65.hb.state =
           uVar34 * (hasher->privat)._H65.hb.factor +
           (uint)ringbuffer[(long)pvVar29 + 0x20U & ringbuffer_mask] +
           ~(uint)ringbuffer[(ulong)pvVar29 & ringbuffer_mask] *
           (hasher->privat)._H65.hb.factor_remove + 1;
      if (uVar31 < 0x1000000) {
        pvVar43 = (hasher->privat)._H35.ha_common.extra[2];
        uVar34 = *(uint *)((long)pvVar43 + (ulong)uVar31 * 4);
        *(int *)((long)pvVar43 + (ulong)uVar31 * 4) = (int)pvVar29;
        if ((pvVar29 == pvVar38) && (uVar34 != 0xffffffff)) {
          uVar31 = (uint32_t)pvVar38 - uVar34;
          if ((void *)(ulong)uVar31 <= pvVar46) {
            puVar28 = (ulong *)(ringbuffer + (uVar34 & uVar42));
            lVar39 = 0;
            puVar40 = puVar20;
            uVar48 = uVar26;
LAB_00e16e4d:
            if (uVar48 < 8) {
              for (uVar55 = 0;
                  (uVar48 != uVar55 &&
                  (*(char *)((long)puVar28 + uVar55) == *(char *)((long)puVar40 + uVar55)));
                  uVar55 = uVar55 + 1) {
              }
            }
            else {
              if (*puVar40 == *puVar28) goto code_r0x00e16e5e;
              uVar55 = *puVar28 ^ *puVar40;
              uVar48 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                }
              }
              uVar55 = uVar48 >> 3 & 0x1fffffff;
            }
            uVar55 = uVar55 - lVar39;
            if ((3 < uVar55) && (local_180 < uVar55)) {
              iVar50 = 0x1f;
              if (uVar31 != 0) {
                for (; uVar31 >> iVar50 == 0; iVar50 = iVar50 + -1) {
                }
              }
              uVar48 = (ulong)(iVar50 * -0x1e + 0x780) + uVar55 * 0x87;
              if (uVar45 < uVar48) {
                iVar35 = 0;
                uVar45 = uVar48;
                local_180 = uVar55;
                local_138 = (void *)(ulong)uVar31;
              }
            }
          }
        }
      }
    }
    (hasher->privat)._H35.ha_common.extra[3] = (void *)((long)pvVar38 + 1);
  }
  if (uVar45 < 0x7e5) {
    local_128 = local_128 + 1;
    position = (long)pvVar38 + 1;
    if (pvVar44 < position) {
      if ((void *)((long)pvVar44 + (ulong)(uint)((int)lVar24 * 4)) < position) {
        pvVar46 = (void *)((long)pvVar38 + 0x11U);
        if (pvVar3 <= (void *)((long)pvVar38 + 0x11U)) {
          pvVar46 = pvVar3;
        }
        for (; position < pvVar46; position = position + 4) {
          uVar26 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar12 >> 0x31;
          uVar5 = *(ushort *)((long)puVar10 + uVar26 * 2);
          uVar34 = (hasher->privat)._H6.block_mask_;
          bVar22 = *(byte *)((long)&hasher->privat + 0x1c);
          *(ushort *)((long)puVar10 + uVar26 * 2) = uVar5 + 1;
          puVar11[(uVar26 << (bVar22 & 0x3f)) + (ulong)(uVar34 & uVar5)] = (uint32_t)position;
          local_128 = local_128 + 4;
        }
      }
      else {
        pvVar46 = (void *)((long)pvVar38 + 9U);
        if (pvVar3 <= (void *)((long)pvVar38 + 9U)) {
          pvVar46 = pvVar3;
        }
        for (; position < pvVar46; position = position + 2) {
          uVar26 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar12 >> 0x31;
          uVar5 = *(ushort *)((long)puVar10 + uVar26 * 2);
          uVar34 = (hasher->privat)._H6.block_mask_;
          bVar22 = *(byte *)((long)&hasher->privat + 0x1c);
          *(ushort *)((long)puVar10 + uVar26 * 2) = uVar5 + 1;
          puVar11[(uVar26 << (bVar22 & 0x3f)) + (ulong)(uVar34 & uVar5)] = (uint32_t)position;
          local_128 = local_128 + 2;
        }
      }
    }
    goto LAB_00e16777;
  }
  uVar48 = local_128 + 4;
  iVar50 = 0;
LAB_00e16ff1:
  uVar55 = uVar26 - 1;
  uVar21 = local_180 - 1;
  if (uVar55 <= local_180 - 1) {
    uVar21 = uVar55;
  }
  if (4 < params->quality) {
    uVar21 = 0;
  }
  pvVar44 = (void *)((long)pvVar38 + 1);
  pvVar46 = pvVar4;
  if (pvVar44 < pvVar4) {
    pvVar46 = pvVar44;
  }
  local_b8 = (void *)((long)pvVar38 + sVar6 + 1);
  if (pvVar4 <= local_b8) {
    local_b8 = pvVar4;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_d4 = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[local_a0 + 0x100] |
                      literal_context_lut[ringbuffer[(ulong)pvVar38 & ringbuffer_mask]]];
    local_a0 = (ulong)ringbuffer[(ulong)pvVar38 & ringbuffer_mask];
  }
  pBVar8 = (params->dictionary).contextual.dict[local_d4];
  uVar27 = (ulong)pvVar44 & ringbuffer_mask;
  puVar20 = (ulong *)(ringbuffer + uVar27);
  uVar19 = 0x7e4;
  pvVar29 = (void *)0x0;
  uVar51 = 0;
  uVar52 = 0;
  do {
    if (uVar52 == (long)(hasher->privat)._H6.num_last_distances_to_check_) {
      uVar30 = *puVar20 * uVar12 >> 0x31;
      lVar39 = uVar30 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      uVar5 = *(ushort *)((long)puVar10 + uVar30 * 2);
      uVar56 = (ulong)uVar5;
      uVar52 = 0;
      if (uVar53 <= uVar56) {
        uVar52 = uVar56 - uVar53;
      }
      uVar34 = (hasher->privat)._H6.block_mask_;
      do {
        uVar37 = uVar51;
        uVar47 = uVar19;
        uVar49 = uVar21;
        local_168 = pvVar29;
        uVar2 = uVar49 + uVar27;
        do {
          do {
            do {
              if (uVar56 <= uVar52) {
LAB_00e17361:
                puVar11[lVar39 + (ulong)(uVar34 & uVar5)] = (uint32_t)pvVar44;
                *(ushort *)((long)puVar10 + uVar30 * 2) = uVar5 + 1;
                iVar57 = 0;
                if (uVar47 != 0x7e4) goto LAB_00e1740c;
                pHVar13 = (hasher->privat)._H6.common_;
                uVar26 = pHVar13->dict_num_lookups;
                local_d0 = pHVar13->dict_num_matches;
                uVar47 = 0x7e4;
                if (local_d0 < uVar26 >> 7) goto LAB_00e1740c;
                uVar21 = (ulong)((uint)((int)*puVar20 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                puVar14 = pBVar8->hash_table_lengths;
                iVar57 = 0;
                lVar39 = 0;
                goto LAB_00e17623;
              }
              uVar56 = uVar56 - 1;
              pvVar29 = (void *)((long)pvVar44 -
                                (ulong)puVar11[lVar39 + (ulong)((uint)uVar56 & uVar34)]);
              if (pvVar46 < pvVar29) goto LAB_00e17361;
            } while (ringbuffer_mask < uVar2);
            uVar19 = (ulong)(puVar11[lVar39 + (ulong)((uint)uVar56 & uVar34)] & uVar42);
            uVar21 = uVar19 + uVar49;
          } while (((ringbuffer_mask < uVar21) || (ringbuffer[uVar2] != ringbuffer[uVar21])) ||
                  (*(int *)(ringbuffer + uVar19) != (int)*puVar20));
          lVar54 = 0;
          uVar21 = uVar26 - 5;
LAB_00e172f2:
          if (uVar21 < 8) {
            for (; (bVar58 = uVar21 != 0, uVar21 = uVar21 - 1, bVar58 &&
                   (ringbuffer[lVar54 + uVar19 + 4] == *(uint8_t *)((long)puVar20 + lVar54 + 4)));
                lVar54 = lVar54 + 1) {
            }
          }
          else {
            uVar51 = *(ulong *)((long)puVar20 + lVar54 + 4);
            if (uVar51 == *(ulong *)(ringbuffer + lVar54 + uVar19 + 4)) goto code_r0x00e17305;
            uVar51 = *(ulong *)(ringbuffer + lVar54 + uVar19 + 4) ^ uVar51;
            uVar21 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            lVar54 = lVar54 + (uVar21 >> 3 & 0x1fffffff);
          }
          uVar21 = lVar54 + 4;
          iVar57 = 0x1f;
          if ((uint)pvVar29 != 0) {
            for (; (uint)pvVar29 >> iVar57 == 0; iVar57 = iVar57 + -1) {
            }
          }
          uVar19 = (ulong)(iVar57 * -0x1e + 0x780) + uVar21 * 0x87;
          uVar51 = uVar21;
        } while (uVar19 <= uVar47);
      } while( true );
    }
    pvVar43 = (void *)(long)dist_cache[uVar52];
    if (((pvVar43 <= pvVar46) && ((void *)((long)pvVar44 - (long)pvVar43) < pvVar44)) &&
       (uVar21 + uVar27 <= ringbuffer_mask)) {
      uVar30 = (ulong)((long)pvVar44 - (long)pvVar43) & ringbuffer_mask;
      uVar56 = uVar30 + uVar21;
      if ((uVar56 <= ringbuffer_mask) && (ringbuffer[uVar21 + uVar27] == ringbuffer[uVar56])) {
        puVar28 = (ulong *)(ringbuffer + uVar30);
        lVar39 = 0;
        puVar40 = puVar20;
        uVar56 = uVar55;
LAB_00e1714f:
        if (uVar56 < 8) {
          for (uVar30 = 0;
              (uVar56 != uVar30 &&
              (*(char *)((long)puVar28 + uVar30) == *(char *)((long)puVar40 + uVar30)));
              uVar30 = uVar30 + 1) {
          }
        }
        else {
          if (*puVar40 == *puVar28) goto code_r0x00e17161;
          uVar30 = *puVar28 ^ *puVar40;
          uVar56 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
            }
          }
          uVar30 = uVar56 >> 3 & 0x1fffffff;
        }
        uVar30 = uVar30 - lVar39;
        if (((2 < uVar30) || ((uVar52 < 2 && (uVar30 == 2)))) &&
           (uVar56 = uVar30 * 0x87 + 0x78f, uVar19 < uVar56)) {
          if (uVar52 != 0) {
            uVar56 = uVar56 - ((0x1ca10U >> ((byte)uVar52 & 0xe) & 0xe) + 0x27);
          }
          if (uVar19 < uVar56) {
            pvVar29 = pvVar43;
            uVar21 = uVar30;
            uVar19 = uVar56;
            uVar51 = uVar30;
          }
        }
      }
    }
    uVar52 = uVar52 + 1;
  } while( true );
code_r0x00e16e5e:
  puVar40 = puVar40 + 1;
  puVar28 = puVar28 + 1;
  uVar48 = uVar48 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e16e4d;
LAB_00e17623:
  if (lVar39 == 2) goto LAB_00e1740c;
  uVar26 = uVar26 + 1;
  pHVar13->dict_num_lookups = uVar26;
  bVar22 = puVar14[uVar21];
  uVar19 = (ulong)bVar22;
  if ((uVar19 != 0) && (uVar19 <= uVar55)) {
    pBVar15 = pBVar8->words;
    puVar28 = (ulong *)(pBVar15->data +
                       (ulong)pBVar15->offsets_by_length[uVar19] +
                       pBVar8->hash_table_words[uVar21] * uVar19);
    lVar54 = 0;
    uVar51 = uVar19;
    puVar40 = puVar20;
LAB_00e1769c:
    if (uVar51 < 8) {
      for (uVar51 = 0;
          ((bVar22 & 7) != uVar51 &&
          (*(char *)((long)puVar40 + uVar51) == *(char *)((long)puVar28 + uVar51)));
          uVar51 = uVar51 + 1) {
      }
    }
    else {
      if (*puVar28 == *puVar40) goto code_r0x00e176af;
      uVar27 = *puVar40 ^ *puVar28;
      uVar51 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
        }
      }
      uVar51 = uVar51 >> 3 & 0x1fffffff;
    }
    uVar51 = uVar51 - lVar54;
    if (((uVar51 != 0) && (uVar19 < pBVar8->cutoffTransformsCount + uVar51)) &&
       (pvVar29 = (void *)((long)local_b8 +
                          ((ulong)((uint)(pBVar8->cutoffTransforms >>
                                         ((char)(uVar19 - uVar51) * '\x06' & 0x3fU)) & 0x3f) +
                           (uVar19 - uVar51) * 4 << (pBVar15->size_bits_by_length[uVar19] & 0x3f)) +
                          (ulong)pBVar8->hash_table_words[uVar21] + lVar25), pvVar29 <= pvVar9)) {
      iVar17 = 0x1f;
      if ((uint)pvVar29 != 0) {
        for (; (uint)pvVar29 >> iVar17 == 0; iVar17 = iVar17 + -1) {
        }
      }
      uVar19 = (uVar51 * 0x87 - (ulong)(uint)(iVar17 * 0x1e)) + 0x780;
      if (uVar47 <= uVar19) {
        iVar57 = (uint)bVar22 - (int)uVar51;
        local_d0 = local_d0 + 1;
        pHVar13->dict_num_matches = local_d0;
        uVar47 = uVar19;
        uVar37 = uVar51;
        local_168 = pvVar29;
      }
    }
  }
  lVar39 = lVar39 + 1;
  uVar21 = uVar21 + 1;
  goto LAB_00e17623;
LAB_00e1740c:
  if (0x1f < uVar55) {
    for (pvVar29 = (hasher->privat)._H35.ha_common.extra[3]; pvVar29 <= pvVar44;
        pvVar29 = (void *)((long)pvVar29 + 1)) {
      uVar34 = (hasher->privat)._H65.hb.state;
      uVar31 = uVar34 & 0x3fffffff;
      (hasher->privat)._H65.hb.state =
           uVar34 * (hasher->privat)._H65.hb.factor +
           (uint)ringbuffer[(long)pvVar29 + 0x20U & ringbuffer_mask] +
           ~(uint)ringbuffer[(ulong)pvVar29 & ringbuffer_mask] *
           (hasher->privat)._H65.hb.factor_remove + 1;
      if (uVar31 < 0x1000000) {
        pvVar43 = (hasher->privat)._H35.ha_common.extra[2];
        uVar34 = *(uint *)((long)pvVar43 + (ulong)uVar31 * 4);
        *(int *)((long)pvVar43 + (ulong)uVar31 * 4) = (int)pvVar29;
        if ((pvVar29 == pvVar44) && (uVar34 != 0xffffffff)) {
          uVar31 = (uint32_t)pvVar44 - uVar34;
          if ((void *)(ulong)uVar31 <= pvVar46) {
            puVar28 = (ulong *)(ringbuffer + (uVar34 & uVar42));
            lVar39 = 0;
            puVar40 = puVar20;
            uVar26 = uVar55;
LAB_00e174c5:
            if (uVar26 < 8) {
              for (uVar21 = 0;
                  (uVar26 != uVar21 &&
                  (*(char *)((long)puVar28 + uVar21) == *(char *)((long)puVar40 + uVar21)));
                  uVar21 = uVar21 + 1) {
              }
            }
            else {
              if (*puVar40 == *puVar28) goto code_r0x00e174d6;
              uVar21 = *puVar28 ^ *puVar40;
              uVar26 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar21 = uVar26 >> 3 & 0x1fffffff;
            }
            uVar21 = uVar21 - lVar39;
            if ((3 < uVar21) && (uVar37 < uVar21)) {
              iVar17 = 0x1f;
              if (uVar31 != 0) {
                for (; uVar31 >> iVar17 == 0; iVar17 = iVar17 + -1) {
                }
              }
              uVar26 = (ulong)(iVar17 * -0x1e + 0x780) + uVar21 * 0x87;
              if (uVar47 < uVar26) {
                iVar57 = 0;
                uVar37 = uVar21;
                uVar47 = uVar26;
                local_168 = (void *)(ulong)uVar31;
              }
            }
          }
        }
      }
    }
    (hasher->privat)._H35.ha_common.extra[3] = (void *)((long)pvVar38 + 2);
  }
  if (uVar47 < uVar45 + 0xaf) {
    uVar37 = local_180;
    local_168 = local_138;
    pvVar44 = pvVar38;
    iVar57 = iVar35;
    sVar18 = local_128;
    local_b8 = (void *)(sVar6 + (long)pvVar38);
    if (pvVar4 <= (void *)(sVar6 + (long)pvVar38)) {
      local_b8 = pvVar4;
    }
    goto LAB_00e17817;
  }
  sVar18 = uVar48;
  if (iVar50 == 3) goto LAB_00e17817;
  local_128 = local_128 + 1;
  iVar50 = iVar50 + 1;
  uVar21 = (long)pvVar38 + 9;
  uVar26 = uVar55;
  uVar45 = uVar47;
  local_180 = uVar37;
  pvVar38 = pvVar44;
  local_138 = local_168;
  sVar18 = local_128;
  iVar35 = iVar57;
  if (uVar1 <= uVar21) goto LAB_00e17817;
  goto LAB_00e16ff1;
code_r0x00e174d6:
  puVar40 = puVar40 + 1;
  puVar28 = puVar28 + 1;
  uVar26 = uVar26 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e174c5;
LAB_00e17817:
  local_128 = sVar18;
  local_b8 = (void *)((long)local_b8 + sVar7);
  if (local_b8 < local_168) {
LAB_00e17842:
    uVar26 = (long)local_168 + 0xf;
  }
  else {
    if (local_168 == (void *)(long)*dist_cache) {
      uVar26 = 0;
      goto LAB_00e178db;
    }
    uVar26 = 1;
    if (local_168 != (void *)(long)dist_cache[1]) {
      uVar26 = (long)local_168 + (3 - (long)*dist_cache);
      if (uVar26 < 7) {
        bVar22 = (byte)((int)uVar26 << 2);
        uVar34 = 0x9750468;
      }
      else {
        uVar26 = (long)local_168 + (3 - (long)dist_cache[1]);
        if (6 < uVar26) {
          uVar26 = 2;
          if ((local_168 != (void *)(long)dist_cache[2]) &&
             (uVar26 = 3, local_168 != (void *)(long)dist_cache[3])) goto LAB_00e17842;
          goto LAB_00e17846;
        }
        bVar22 = (byte)((int)uVar26 << 2);
        uVar34 = 0xfdb1ace;
      }
      uVar26 = (ulong)(uVar34 >> (bVar22 & 0x1f) & 0xf);
    }
  }
LAB_00e17846:
  if ((local_168 <= local_b8) && (uVar26 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar16 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar16;
    iVar35 = (int)local_168;
    *dist_cache = iVar35;
    uVar34 = (uint)(hasher->privat)._H35.hb.next_ix;
    if (4 < (int)uVar34) {
      dist_cache[4] = iVar35 + -1;
      dist_cache[5] = iVar35 + 1;
      dist_cache[6] = iVar35 + -2;
      dist_cache[7] = iVar35 + 2;
      dist_cache[8] = iVar35 + -3;
      dist_cache[9] = iVar35 + 3;
      if (10 < uVar34) {
        iVar35 = (int)uVar16;
        dist_cache[10] = iVar35 + -1;
        dist_cache[0xb] = iVar35 + 1;
        dist_cache[0xc] = iVar35 + -2;
        dist_cache[0xd] = iVar35 + 2;
        *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar35 + 3,iVar35 + -3);
      }
    }
  }
LAB_00e178db:
  uVar34 = (uint)local_128;
  local_f8->insert_len_ = uVar34;
  local_190 = (uint)uVar37;
  local_f8->copy_len_ = iVar57 << 0x19 | local_190;
  uVar55 = (ulong)(params->dist).num_direct_distance_codes;
  uVar48 = uVar55 + 0x10;
  uVar32 = 0;
  if (uVar48 <= uVar26) {
    uVar42 = (params->dist).distance_postfix_bits;
    bVar22 = (byte)uVar42;
    uVar55 = ((uVar26 - uVar55) + (4L << (bVar22 & 0x3f))) - 0x10;
    uVar31 = 0x1f;
    uVar33 = (uint)uVar55;
    if (uVar33 != 0) {
      for (; uVar33 >> uVar31 == 0; uVar31 = uVar31 - 1) {
      }
    }
    uVar31 = (uVar31 ^ 0xffffffe0) + 0x1f;
    uVar21 = (ulong)((uVar55 >> ((ulong)uVar31 & 0x3f) & 1) != 0);
    lVar39 = (ulong)uVar31 - (ulong)uVar42;
    uVar26 = (~(-1 << (bVar22 & 0x1f)) & uVar33) + uVar48 +
             (uVar21 + lVar39 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar39 * 0x400;
    uVar32 = (uint32_t)(uVar55 - (uVar21 + 2 << ((byte)uVar31 & 0x3f)) >> (bVar22 & 0x3f));
  }
  local_f8->dist_prefix_ = (uint16_t)uVar26;
  local_f8->dist_extra_ = uVar32;
  if (5 < local_128) {
    if (local_128 < 0x82) {
      uVar34 = 0x1f;
      uVar42 = (uint)(local_128 - 2);
      if (uVar42 != 0) {
        for (; uVar42 >> uVar34 == 0; uVar34 = uVar34 - 1) {
        }
      }
      uVar34 = (int)(local_128 - 2 >> ((char)(uVar34 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar34 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_128 < 0x842) {
      uVar42 = 0x1f;
      if (uVar34 - 0x42 != 0) {
        for (; uVar34 - 0x42 >> uVar42 == 0; uVar42 = uVar42 - 1) {
        }
      }
      uVar34 = (uVar42 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar34 = 0x15;
      if (0x1841 < local_128) {
        uVar34 = (uint)(ushort)(0x17 - (local_128 < 0x5842));
      }
    }
  }
  local_190 = iVar57 + local_190;
  if (local_190 < 10) {
    uVar42 = local_190 - 2;
  }
  else if (local_190 < 0x86) {
    local_190 = local_190 - 6;
    uVar42 = 0x1f;
    if (local_190 != 0) {
      for (; local_190 >> uVar42 == 0; uVar42 = uVar42 - 1) {
      }
    }
    uVar42 = (local_190 >> ((char)(uVar42 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar42 ^ 0xffffffe0) * 2
             + 0x42;
  }
  else {
    uVar42 = 0x17;
    if (local_190 < 0x846) {
      uVar42 = 0x1f;
      if (local_190 - 0x46 != 0) {
        for (; local_190 - 0x46 >> uVar42 == 0; uVar42 = uVar42 - 1) {
        }
      }
      uVar42 = (uVar42 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar42;
  uVar41 = (uVar5 & 7) + ((ushort)uVar34 & 7) * 8;
  if ((((uVar26 & 0x3ff) == 0) && ((ushort)uVar34 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar41 = uVar41 + 0x40;
    }
  }
  else {
    iVar35 = ((uVar34 & 0xffff) >> 3) * 3 + ((uVar42 & 0xffff) >> 3);
    uVar41 = uVar41 + ((ushort)(0x520d40 >> ((char)iVar35 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar35 * 0x40 + 0x40;
  }
  local_f8->cmd_prefix_ = uVar41;
  *num_literals = *num_literals + local_128;
  position = uVar37 + (long)pvVar44;
  pvVar38 = pvVar23;
  if (position < pvVar23) {
    pvVar38 = (void *)position;
  }
  pvVar46 = (void *)((long)pvVar44 + 2);
  if (local_168 < (void *)(uVar37 >> 2)) {
    pvVar29 = (void *)(position + (long)local_168 * -4);
    if (pvVar29 < pvVar46) {
      pvVar29 = pvVar46;
    }
    pvVar46 = pvVar29;
    if (pvVar38 < pvVar29) {
      pvVar46 = pvVar38;
    }
  }
  pvVar44 = (void *)((long)pvVar44 + uVar37 * 2 + lVar24);
  local_f8 = local_f8 + 1;
  for (; pvVar46 < pvVar38; pvVar46 = (void *)((long)pvVar46 + 1)) {
    uVar26 = *(long *)(ringbuffer + ((ulong)pvVar46 & ringbuffer_mask)) *
             (hasher->privat)._H6.hash_mul_ >> 0x31;
    uVar5 = *(ushort *)((long)puVar10 + uVar26 * 2);
    uVar34 = (hasher->privat)._H6.block_mask_;
    bVar22 = *(byte *)((long)&hasher->privat + 0x1c);
    *(ushort *)((long)puVar10 + uVar26 * 2) = uVar5 + 1;
    puVar11[(uVar26 << (bVar22 & 0x3f)) + (ulong)(uVar34 & uVar5)] = (uint32_t)pvVar46;
  }
  local_128 = 0;
  goto LAB_00e16766;
code_r0x00e176af:
  puVar28 = puVar28 + 1;
  puVar40 = puVar40 + 1;
  uVar51 = uVar51 - 8;
  lVar54 = lVar54 + -8;
  goto LAB_00e1769c;
code_r0x00e17305:
  uVar21 = uVar21 - 8;
  lVar54 = lVar54 + 8;
  goto LAB_00e172f2;
code_r0x00e17161:
  puVar40 = puVar40 + 1;
  puVar28 = puVar28 + 1;
  uVar56 = uVar56 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e1714f;
code_r0x00e16c7f:
  puVar28 = puVar28 + 1;
  puVar40 = puVar40 + 1;
  uVar19 = uVar19 - 8;
  lVar54 = lVar54 + -8;
  goto LAB_00e16c6d;
code_r0x00e16ad7:
  uVar48 = uVar48 - 8;
  lVar54 = lVar54 + 8;
  goto LAB_00e16ac3;
code_r0x00e16911:
  puVar40 = puVar40 + 1;
  puVar28 = puVar28 + 1;
  uVar51 = uVar51 - 8;
  lVar39 = lVar39 + -8;
  goto LAB_00e168ff;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}